

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerSettings.cpp
# Opt level: O2

void __thiscall I2sAnalyzerSettings::LoadSettings(I2sAnalyzerSettings *this,char *settings)

{
  char cVar1;
  int iVar2;
  SimpleArchive text_archive;
  PcmWordSelectInverted word_inverted;
  Sign sign;
  char *name_string;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&name_string);
  iVar2 = strcmp(name_string,"SaleaeI2sPcmAnalyzer");
  if (iVar2 != 0) {
    AnalyzerHelpers::Assert
              ("SaleaeI2sPcmAnalyzer: Provided with a settings string that doesn\'t belong to us;");
  }
  SimpleArchive::operator>>(&text_archive,&this->mClockChannel);
  SimpleArchive::operator>>(&text_archive,&this->mFrameChannel);
  SimpleArchive::operator>>(&text_archive,&this->mDataChannel);
  SimpleArchive::operator>>(&text_archive,&this->mShiftOrder);
  SimpleArchive::operator>>(&text_archive,&this->mDataValidEdge);
  SimpleArchive::operator>>(&text_archive,&this->mBitsPerWord);
  SimpleArchive::operator>>(&text_archive,&this->mWordAlignment);
  SimpleArchive::operator>>(&text_archive,&this->mFrameType);
  SimpleArchive::operator>>(&text_archive,&this->mBitAlignment);
  cVar1 = SimpleArchive::operator>>(&text_archive,&sign);
  if (cVar1 != '\0') {
    this->mSigned = sign;
  }
  cVar1 = SimpleArchive::operator>>(&text_archive,&word_inverted);
  if (cVar1 != '\0') {
    this->mWordSelectInverted = word_inverted;
  }
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,false);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mFrameChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDataChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void I2sAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeI2sPcmAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeI2sPcmAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mClockChannel;
    text_archive >> mFrameChannel;
    text_archive >> mDataChannel;

    text_archive >> *( U32* )&mShiftOrder;
    text_archive >> *( U32* )&mDataValidEdge;
    text_archive >> mBitsPerWord;

    text_archive >> *( U32* )&mWordAlignment;
    text_archive >> *( U32* )&mFrameType;
    text_archive >> *( U32* )&mBitAlignment;

    // check to make sure loading it actual works befor assigning the result -- do this when adding settings to an anylzer which has been
    // previously released.
    AnalyzerEnums::Sign sign;
    if( text_archive >> *( U32* )&sign )
        mSigned = sign;

    PcmWordSelectInverted word_inverted;
    if( text_archive >> *( U32* )&word_inverted )
        mWordSelectInverted = word_inverted;

    ClearChannels();
    AddChannel( mClockChannel, "PCM CLOCK", true );
    AddChannel( mFrameChannel, "PCM FRAME", true );
    AddChannel( mDataChannel, "PCM DATA", true );

    UpdateInterfacesFromSettings();
}